

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O2

int element7(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  uint *puVar1;
  int iVar2;
  code *pcVar3;
  bool bVar4;
  
  pcVar3 = element6;
  switch(tok) {
  case 0x23:
    puVar1 = &state->level;
    *puVar1 = *puVar1 - 1;
    bVar4 = *puVar1 == 0;
    iVar2 = 0x2a;
    break;
  case 0x24:
    puVar1 = &state->level;
    *puVar1 = *puVar1 - 1;
    bVar4 = *puVar1 == 0;
    iVar2 = 0x29;
    break;
  case 0x25:
    puVar1 = &state->level;
    *puVar1 = *puVar1 - 1;
    bVar4 = *puVar1 == 0;
    iVar2 = 0x2b;
    break;
  case 0x26:
    iVar2 = 0x2d;
    goto LAB_0015bb23;
  default:
    if (tok == 0xf) {
      return 0;
    }
    if (tok == 0x15) {
      iVar2 = 0x2c;
      goto LAB_0015bb23;
    }
    if (tok != 0x18) {
      iVar2 = -1;
      pcVar3 = error;
      if ((tok == 0x1c) && (state->documentEntity == 0)) {
        return 0x34;
      }
      goto LAB_0015bb23;
    }
    puVar1 = &state->level;
    *puVar1 = *puVar1 - 1;
    bVar4 = *puVar1 == 0;
    iVar2 = 0x28;
  }
  if (!bVar4) {
    return iVar2;
  }
  pcVar3 = declClose;
LAB_0015bb23:
  state->handler = pcVar3;
  return iVar2;
}

Assistant:

static
int element7(PROLOG_STATE *state,
             int tok,
             const char *ptr,
             const char *end,
             const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_CLOSE_PAREN:
    state->level -= 1;
    if (state->level == 0)
      state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE;
  case XML_TOK_CLOSE_PAREN_ASTERISK:
    state->level -= 1;
    if (state->level == 0)
      state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE_REP;
  case XML_TOK_CLOSE_PAREN_QUESTION:
    state->level -= 1;
    if (state->level == 0)
      state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE_OPT;
  case XML_TOK_CLOSE_PAREN_PLUS:
    state->level -= 1;
    if (state->level == 0)
      state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE_PLUS;
  case XML_TOK_COMMA:
    state->handler = element6;
    return XML_ROLE_GROUP_SEQUENCE;
  case XML_TOK_OR:
    state->handler = element6;
    return XML_ROLE_GROUP_CHOICE;
  }
  return common(state, tok);
}